

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vision.c
# Opt level: O0

void left_side(int row,int left_mark,int right,char *limits)

{
  bool bVar1;
  int row_00;
  int local_5c;
  int local_54;
  char *pcStack_50;
  int lim_min;
  char *row_max;
  char *row_min;
  char *rowp;
  int i;
  int result;
  int deeper;
  int nrow;
  int left_edge;
  int left;
  char *limits_local;
  int local_10;
  int right_local;
  int left_mark_local;
  int row_local;
  
  pcStack_50 = (char *)0x0;
  row_max = (char *)0x0;
  row_min = (char *)0x0;
  row_00 = row + step;
  bVar1 = false;
  if (((-1 < row_00) && (bVar1 = false, row_00 < 0x15)) && (bVar1 = true, limits != (char *)0x0)) {
    bVar1 = limits[1] <= *limits;
  }
  if (vis_func == (_func_void_int_int_void_ptr *)0x0) {
    row_min = cs_rows[row];
    row_max = cs_left + row;
    pcStack_50 = cs_right + row;
  }
  limits_local._4_4_ = right;
  local_10 = left_mark;
  if (limits == (char *)0x0) {
    local_54 = 0;
    _left_edge = (char *)0x0;
  }
  else {
    local_54 = start_col - *limits;
    if (local_54 < 0) {
      local_54 = 0;
    }
    if (left_mark < local_54) {
      local_10 = local_54;
    }
    _left_edge = limits + 1;
  }
  do {
    while( true ) {
      while( true ) {
        if (limits_local._4_4_ < local_10) {
          return;
        }
        deeper = (int)left_ptrs[row][limits_local._4_4_];
        if (deeper < local_54) {
          deeper = local_54;
        }
        if (viz_clear_rows[row][limits_local._4_4_] != '\0') break;
        if (deeper < local_10) {
          if (viz_clear_rows[row - step][local_10] == '\0') {
            local_5c = local_10;
          }
          else {
            local_5c = local_10 + -1;
          }
          deeper = local_5c;
        }
        if (vis_func == (_func_void_int_int_void_ptr *)0x0) {
          for (rowp._0_4_ = deeper; (int)rowp <= limits_local._4_4_; rowp._0_4_ = (int)rowp + 1) {
            row_min[(int)rowp] = '\x01';
          }
          if (deeper < *row_max) {
            *row_max = (char)deeper;
          }
          if (*pcStack_50 < limits_local._4_4_) {
            *pcStack_50 = (char)limits_local._4_4_;
          }
        }
        else {
          for (rowp._0_4_ = deeper; (int)rowp <= limits_local._4_4_; rowp._0_4_ = (int)rowp + 1) {
            (*vis_func)((int)rowp,row,varg);
          }
        }
        limits_local._4_4_ = deeper + -1;
      }
      if (limits_local._4_4_ != start_col) break;
LAB_003349a7:
      if (deeper < local_10) {
        for (nrow = local_10; deeper <= nrow; nrow = nrow + -1) {
          if (step < 0) {
            rowp._4_4_ = q2_path(start_row,start_col,row,nrow);
          }
          else {
            rowp._4_4_ = q3_path(start_row,start_col,row,nrow);
          }
          if (rowp._4_4_ == 0) break;
        }
        nrow = nrow + 1;
      }
      else {
        nrow = deeper;
      }
      if (nrow <= limits_local._4_4_) {
        if (((nrow == limits_local._4_4_) && (limits_local._4_4_ == start_col)) &&
           ((0 < start_col && (viz_clear_rows[row][start_col + -1] == '\0')))) {
          nrow = start_col + -1;
        }
        if (nrow < local_54) {
          nrow = local_54;
        }
        if (vis_func == (_func_void_int_int_void_ptr *)0x0) {
          for (rowp._0_4_ = nrow; (int)rowp <= limits_local._4_4_; rowp._0_4_ = (int)rowp + 1) {
            row_min[(int)rowp] = '\x01';
          }
          if (nrow < *row_max) {
            *row_max = (char)nrow;
          }
          if (*pcStack_50 < limits_local._4_4_) {
            *pcStack_50 = (char)limits_local._4_4_;
          }
        }
        else {
          for (rowp._0_4_ = nrow; (int)rowp <= limits_local._4_4_; rowp._0_4_ = (int)rowp + 1) {
            (*vis_func)((int)rowp,row,varg);
          }
        }
        if (bVar1) {
          left_side(row_00,nrow,limits_local._4_4_,_left_edge);
        }
        limits_local._4_4_ = nrow + -1;
      }
    }
    for (; deeper <= limits_local._4_4_; limits_local._4_4_ = limits_local._4_4_ + -1) {
      if (step < 0) {
        rowp._4_4_ = q2_path(start_row,start_col,row,limits_local._4_4_);
      }
      else {
        rowp._4_4_ = q3_path(start_row,start_col,row,limits_local._4_4_);
      }
      if (rowp._4_4_ != 0) break;
    }
    if (limits_local._4_4_ < local_54) {
      return;
    }
    if (limits_local._4_4_ == local_54) {
      if (vis_func != (_func_void_int_int_void_ptr *)0x0) {
        (*vis_func)(local_54,row,varg);
        return;
      }
      row_min[local_54] = '\x01';
      if (*row_max <= local_54) {
        return;
      }
      *row_max = (char)local_54;
      return;
    }
    if (deeper < limits_local._4_4_) goto LAB_003349a7;
    limits_local._4_4_ = deeper;
  } while( true );
}

Assistant:

static void left_side(int row, int left_mark, int right, const char *limits)
{
    int		  left, left_edge, nrow, deeper, result;
    int  i;
    char *rowp;
    char	  *row_min, *row_max;
    int		  lim_min;

    rowp = row_min = row_max = 0;
    nrow    = row+step;
    deeper  = good_row(nrow) && (!limits || (*limits >= *(limits+1)));
    if (!vis_func) {
	rowp    = cs_rows[row];
	row_min = &cs_left[row];
	row_max = &cs_right[row];
    }
    if (limits) {
	lim_min = start_col - *limits;
	if (lim_min < 0) lim_min = 0;
	if (left_mark < lim_min) left_mark = lim_min;
	limits++; /* prepare for next row */
    } else
	lim_min = 0;

    while (right >= left_mark) {
	left_edge = left_ptrs[row][right];
	if (left_edge < lim_min) left_edge = lim_min;

	if (!is_clear(row,right)) {
	    /* Jump to the far side of a stone wall. */
	    if (left_edge < left_mark) {
		/* Maybe see more (kludge). */
		left_edge = is_clear(row-step,left_mark) ?
						    left_mark-1 : left_mark;
	    }
	    if (vis_func) {
		for (i = left_edge; i <= right; i++) (*vis_func)(i, row, varg);
	    } else {
		for (i = left_edge; i <= right; i++) set_cs(rowp,i);
		set_min(left_edge); set_max(right);
	    }
	    right = left_edge - 1; /* no limit check necessary */
	    continue;
	}

	if (right != start_col) {
	    /* Find the right side. */
	    for (; right >= left_edge; right--) {
		if (step < 0) {
		    result = q2_path(start_row,start_col,row,right);
		} else {
		    result = q3_path(start_row,start_col,row,right);
		}
		if (result) break;
	    }

	    /* Check for boundary conditions. */
	    if (right < lim_min) return;
	    if (right == lim_min) {
		if (vis_func) (*vis_func)(lim_min, row, varg);
		else {
		    set_cs(rowp,lim_min);
		    set_min(lim_min);
		}
		return;
	    }
	    /* Check if we can see any spots in the opening. */
	    if (right <= left_edge) {
		right = left_edge;
		continue;
	    }
	}

	/* Find the left side. */
	if (left_mark > left_edge) {
	    for (left = left_mark; left >= left_edge; --left) {
		if (step < 0) {
		    result = q2_path(start_row,start_col,row,left);
		} else {
		    result = q3_path(start_row,start_col,row,left);
		}
		if (!result) break;
	    }
	    left++;	/* get rid of the last decrement */
	}
	else
	    left = left_edge;

	if (left <= right) {
	    /* An ugly special case. */
	    if (left == right && right == start_col &&
			    start_col > 0 && !is_clear(row,start_col-1))
		left = start_col-1;

	    if (left < lim_min) left = lim_min;
	    if (vis_func)
		for (i = left; i <= right; i++) (*vis_func)(i, row, varg);
	    else {
		for (i = left; i <= right; i++) set_cs(rowp,i);
		set_min(left);      set_max(right);
	    }

	    /* Recurse */
	    if (deeper) left_side(nrow,left,right,limits);
	    right = left - 1; /* no limit check necessary */
	}
    }
}